

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFF_ATC_NAVAIDS_FundamentalParameterData.cpp
# Opt level: O3

void __thiscall
KDIS::DATA_TYPE::IFF_ATC_NAVAIDS_FundamentalParameterData::IFF_ATC_NAVAIDS_FundamentalParameterData
          (IFF_ATC_NAVAIDS_FundamentalParameterData *this,KFLOAT32 ERP,KFLOAT32 Freq,KFLOAT32 PgRF,
          KFLOAT32 PulseWidth,KUINT32 BurstLength,SystemMode M)

{
  DataTypeBase::DataTypeBase(&this->super_DataTypeBase);
  (this->super_DataTypeBase)._vptr_DataTypeBase =
       (_func_int **)&PTR__IFF_ATC_NAVAIDS_FundamentalParameterData_00233ba8;
  this->m_f32ERP = ERP;
  this->m_f32Freq = Freq;
  this->m_f32PgRF = PgRF;
  this->m_f32PulseWidth = PulseWidth;
  this->m_ui32BurstLength = BurstLength;
  this->m_ui8AppMode = (KUINT8)M;
  this->m_ui16Padding1 = 0;
  this->m_ui8Padding2 = '\0';
  return;
}

Assistant:

IFF_ATC_NAVAIDS_FundamentalParameterData::IFF_ATC_NAVAIDS_FundamentalParameterData( KFLOAT32 ERP, KFLOAT32 Freq, KFLOAT32 PgRF, KFLOAT32 PulseWidth,
        KUINT32 BurstLength, SystemMode M ) :
    m_f32ERP( ERP ),
    m_f32Freq( Freq ),
    m_f32PgRF( PgRF ),
    m_f32PulseWidth( PulseWidth ),
    m_ui32BurstLength( BurstLength ),
    m_ui8AppMode( M ),
    m_ui16Padding1( 0 ),
    m_ui8Padding2( 0 )
{
}